

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFx.c
# Opt level: O0

void Div_CubePrintOne(Vec_Int_t *vCube,Vec_Str_t *vStr,int nVars)

{
  char Entry;
  int iVar1;
  int i_00;
  char *pcVar2;
  int local_20;
  int Lit;
  int i;
  int nVars_local;
  Vec_Str_t *vStr_local;
  Vec_Int_t *vCube_local;
  
  Vec_StrFill(vStr,nVars,'-');
  for (local_20 = 0; iVar1 = Vec_IntSize(vCube), local_20 < iVar1; local_20 = local_20 + 1) {
    iVar1 = Vec_IntEntry(vCube,local_20);
    i_00 = Abc_Lit2Var(iVar1);
    iVar1 = Abc_LitIsCompl(iVar1);
    Entry = '1';
    if (iVar1 != 0) {
      Entry = '0';
    }
    Vec_StrWriteEntry(vStr,i_00,Entry);
  }
  pcVar2 = Vec_StrArray(vStr);
  printf("%s\n",pcVar2);
  return;
}

Assistant:

void Div_CubePrintOne( Vec_Int_t * vCube, Vec_Str_t * vStr, int nVars )
{
    int i, Lit;
    Vec_StrFill( vStr, nVars, '-' );
    Vec_IntForEachEntry( vCube, Lit, i )
        Vec_StrWriteEntry( vStr, Abc_Lit2Var(Lit), (char)(Abc_LitIsCompl(Lit) ? '0' : '1') );
    printf( "%s\n", Vec_StrArray(vStr) );
}